

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O0

vm_obj_id_t CVmObjTimeZone::create(CVmTimeZone *tz)

{
  vm_obj_id_t vVar1;
  vm_obj_id_t id;
  undefined4 in_stack_ffffffffffffffe8;
  vm_obj_id_t in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  vVar1 = vm_new_id(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  CVmObject::operator_new(CONCAT44(vVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  CVmObjTimeZone((CVmObjTimeZone *)CONCAT44(vVar1,in_stack_fffffffffffffff0),
                 (CVmTimeZone *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjTimeZone::create(VMG_ CVmTimeZone *tz)
{
    /* allocate the object ID and create the object */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
    new (vmg_ id) CVmObjTimeZone(vmg_ tz);

    /* return the new ID */
    return id;
}